

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkCompareOp Diligent::ComparisonFuncToVkCompareOp(COMPARISON_FUNCTION CmpFunc)

{
  Char *pCVar1;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  COMPARISON_FUNCTION CmpFunc_local;
  
  msg.field_2._M_local_buf[0xb] = CmpFunc;
  switch(CmpFunc) {
  case COMPARISON_FUNC_UNKNOWN:
    FormatString<char[37]>((string *)local_30,(char (*) [37])"Comparison function is not specified")
    ;
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"ComparisonFuncToVkCompareOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x2e4);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._12_4_ = 7;
    break;
  case COMPARISON_FUNC_NEVER:
    msg.field_2._12_4_ = 0;
    break;
  case COMPARISON_FUNC_LESS:
    msg.field_2._12_4_ = 1;
    break;
  case COMPARISON_FUNC_EQUAL:
    msg.field_2._12_4_ = 2;
    break;
  case COMPARISON_FUNC_LESS_EQUAL:
    msg.field_2._12_4_ = 3;
    break;
  case COMPARISON_FUNC_GREATER:
    msg.field_2._12_4_ = 4;
    break;
  case COMPARISON_FUNC_NOT_EQUAL:
    msg.field_2._12_4_ = 5;
    break;
  case COMPARISON_FUNC_GREATER_EQUAL:
    msg.field_2._12_4_ = 6;
    break;
  case COMPARISON_FUNC_ALWAYS:
    msg.field_2._12_4_ = 7;
    break;
  default:
    FormatString<char[28]>((string *)local_60,(char (*) [28])"Unknown comparison function");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"ComparisonFuncToVkCompareOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x2f2);
    std::__cxx11::string::~string((string *)local_60);
    msg.field_2._12_4_ = 7;
  }
  return msg.field_2._12_4_;
}

Assistant:

VkCompareOp ComparisonFuncToVkCompareOp(COMPARISON_FUNCTION CmpFunc)
{
    switch (CmpFunc)
    {
        // clang-format off
        case COMPARISON_FUNC_UNKNOWN:
            UNEXPECTED("Comparison function is not specified" );
            return VK_COMPARE_OP_ALWAYS;

        case COMPARISON_FUNC_NEVER:         return VK_COMPARE_OP_NEVER;
        case COMPARISON_FUNC_LESS:          return VK_COMPARE_OP_LESS;
        case COMPARISON_FUNC_EQUAL:         return VK_COMPARE_OP_EQUAL;
        case COMPARISON_FUNC_LESS_EQUAL:    return VK_COMPARE_OP_LESS_OR_EQUAL;
        case COMPARISON_FUNC_GREATER:       return VK_COMPARE_OP_GREATER;
        case COMPARISON_FUNC_NOT_EQUAL:     return VK_COMPARE_OP_NOT_EQUAL;
        case COMPARISON_FUNC_GREATER_EQUAL: return VK_COMPARE_OP_GREATER_OR_EQUAL;
        case COMPARISON_FUNC_ALWAYS:        return VK_COMPARE_OP_ALWAYS;
            // clang-format on

        default:
            UNEXPECTED("Unknown comparison function");
            return VK_COMPARE_OP_ALWAYS;
    }
}